

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O2

void __thiscall
anon_unknown.dwarf_15cac53::entry_to_remove::entry_to_remove
          (entry_to_remove *this,string *name,cmMakefile *makefile)

{
  cmValue cVar1;
  string local_b0;
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  
  this->count = -1;
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  (this->value)._M_string_length = 0;
  (this->value).field_2._M_local_buf[0] = '\0';
  local_60.View_._M_len = 0x1a;
  local_60.View_._M_str = "_CMAKE_SYSTEM_PREFIX_PATH_";
  local_90.View_._M_str = (name->_M_dataplus)._M_p;
  local_90.View_._M_len = name->_M_string_length;
  cmStrCat<char[14]>(&local_b0,&local_60,&local_90,(char (*) [14])0x5a52e5);
  cVar1 = cmMakefile::GetDefinition(makefile,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  if (cVar1.Value != (string *)0x0) {
    cmStrToLong(cVar1.Value,&this->count);
  }
  local_60.View_._M_len = 0x1a;
  local_60.View_._M_str = "_CMAKE_SYSTEM_PREFIX_PATH_";
  local_90.View_._M_str = (name->_M_dataplus)._M_p;
  local_90.View_._M_len = name->_M_string_length;
  cmStrCat<char[14]>(&local_b0,&local_60,&local_90,(char (*) [14])0x5a5314);
  cVar1 = cmMakefile::GetDefinition(makefile,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  if (cVar1.Value != (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)&this->value);
  }
  return;
}

Assistant:

entry_to_remove(std::string const& name, cmMakefile* makefile)
    : value()
  {
    if (cmValue to_skip = makefile->GetDefinition(
          cmStrCat("_CMAKE_SYSTEM_PREFIX_PATH_", name, "_PREFIX_COUNT"))) {
      cmStrToLong(to_skip, &count);
    }
    if (cmValue prefix_value = makefile->GetDefinition(
          cmStrCat("_CMAKE_SYSTEM_PREFIX_PATH_", name, "_PREFIX_VALUE"))) {
      value = *prefix_value;
    }
  }